

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcursor.cpp
# Opt level: O2

void QCursorData::initialize(void)

{
  QCursorData *this;
  int shape;
  long lVar1;
  QCursorData **ppQVar2;
  
  if (!initialized) {
    ppQVar2 = qt_cursorTable;
    for (lVar1 = 0; lVar1 != 0x16; lVar1 = lVar1 + 1) {
      this = (QCursorData *)operator_new(0x38);
      QCursorData(this,(CursorShape)lVar1);
      *ppQVar2 = this;
      ppQVar2 = ppQVar2 + 1;
    }
    initialized = true;
  }
  return;
}

Assistant:

void QCursorData::initialize()
{
    if (QCursorData::initialized)
        return;
    for (int shape = 0; shape <= Qt::LastCursor; ++shape)
        qt_cursorTable[shape] = new QCursorData((Qt::CursorShape)shape);
    QCursorData::initialized = true;
}